

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

string * __thiscall
libcellml::Analyser::AnalyserImpl::expression_abi_cxx11_
          (string *__return_storage_ptr__,AnalyserImpl *this,AnalyserEquationAstPtr *ast,
          bool includeHierarchy)

{
  undefined3 in_register_00000009;
  undefined4 uVar1;
  undefined4 in_register_0000000c;
  char *__rhs;
  AnalyserEquationAstPtr equationAstParent;
  AnalyserEquationAstPtr equationAst;
  AnalyserEquationAstPtr equationAstGrandparent;
  allocator<char> local_141;
  string *local_140;
  __shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  __shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2> local_f8;
  string local_e0;
  AnalyserImpl *local_c0;
  GeneratorProfilePtr *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = CONCAT31(in_register_00000009,includeHierarchy);
  local_b8 = &this->mGeneratorProfile;
  Generator::equationCode_abi_cxx11_
            (&local_e0,(Generator *)ast,(AnalyserEquationAstPtr *)local_b8,
             (GeneratorProfilePtr *)CONCAT44(in_register_0000000c,uVar1));
  std::operator+(&local_128,"\'",&local_e0);
  std::operator+(__return_storage_ptr__,&local_128,"\'");
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e0);
  if (includeHierarchy) {
    std::__shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_108,
               &ast->super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>)
    ;
    local_140 = __return_storage_ptr__;
    AnalyserEquationAst::parent((AnalyserEquationAst *)&local_138);
    local_c0 = this;
    if (local_138._M_ptr == (element_type *)0x0) {
      local_f8._M_ptr = (element_type *)0x0;
      local_f8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      AnalyserEquationAst::parent((AnalyserEquationAst *)&local_f8);
    }
    while (local_138._M_ptr != (element_type *)0x0) {
      std::__shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_108,&local_138);
      std::__shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_138,&local_f8);
      if (local_138._M_ptr == (element_type *)0x0) {
        local_128._M_dataplus._M_p = (pointer)0x0;
        local_128._M_string_length = 0;
      }
      else {
        AnalyserEquationAst::parent((AnalyserEquationAst *)&local_128);
      }
      std::__shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_f8,
                 (__shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50," in",&local_141);
      __rhs = "";
      if (local_138._M_ptr == (element_type *)0x0) {
        __rhs = " equation";
      }
      std::operator+(&local_90,&local_50,__rhs);
      std::operator+(&local_b0,&local_90," \'");
      Generator::equationCode_abi_cxx11_
                (&local_70,(Generator *)&local_108,(AnalyserEquationAstPtr *)local_b8,
                 (GeneratorProfilePtr *)CONCAT44(in_register_0000000c,uVar1));
      std::operator+(&local_e0,&local_b0,&local_70);
      std::operator+(&local_128,&local_e0,"\'");
      std::__cxx11::string::append((string *)local_140);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    componentName_abi_cxx11_(&local_b0,local_c0,(AnalyserEquationAstPtr *)&local_108);
    __return_storage_ptr__ = local_140;
    std::operator+(&local_e0," in component \'",&local_b0);
    std::operator+(&local_128,&local_e0,"\'");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Analyser::AnalyserImpl::expression(const AnalyserEquationAstPtr &ast,
                                               bool includeHierarchy)
{
    // Return the generated code for the given AST, specifying the equation and
    // component in which it is, if needed and requested.

    std::string res = "'" + Generator::equationCode(ast, mGeneratorProfile) + "'";

    if (includeHierarchy) {
        auto equationAst = ast;
        auto equationAstParent = ast->parent();
        auto equationAstGrandparent = (equationAstParent != nullptr) ? equationAstParent->parent() : nullptr;

        while (equationAstParent != nullptr) {
            equationAst = equationAstParent;
            equationAstParent = equationAstGrandparent;
            equationAstGrandparent = (equationAstParent != nullptr) ? equationAstParent->parent() : nullptr;

            res += std::string(" in")
                   + ((equationAstParent == nullptr) ? " equation" : "")
                   + " '" + Generator::equationCode(equationAst, mGeneratorProfile) + "'";
        }

        res += " in component '" + componentName(equationAst) + "'";
    }

    return res;
}